

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmlite_init.c
# Opt level: O2

int CRYPTO_init(void)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = CRYPTO_crit_enter();
  uVar2 = 0;
  if (iVar1 == 0) {
    if (initialized == 0) {
      iVar1 = CRYPTO_alloc_init();
      if (iVar1 == 0) {
LAB_0010b2d8:
        abort();
      }
      iVar1 = sm2_group_init();
      if (iVar1 == 0) goto LAB_0010b2d8;
      iVar1 = sm9_group_init();
      if (iVar1 == 0) goto LAB_0010b2d8;
      iVar1 = sm9_pairing_init();
      if (iVar1 == 0) goto LAB_0010b2d8;
      _runtime_get_cpu_features();
      runtime_choose_sm3_implementation();
      runtime_choose_rand_implementation();
      initialized = 1;
    }
    iVar1 = CRYPTO_crit_leave();
    uVar2 = (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

int CRYPTO_init()
{
    if (CRYPTO_crit_enter() != 0) 
        return GML_ERROR; /* LCOV_EXCL_LINE */

    if (initialized != 0) {
        if (CRYPTO_crit_leave() != 0) 
            return GML_ERROR; /* LCOV_EXCL_LINE */
        return GML_OK;
    }

    if (init_globals() == GML_ERROR) 
        abort();

    _runtime_get_cpu_features();

    runtime_choose_best_implementation();

    initialized = 1;
    if (CRYPTO_crit_leave() != 0)
        return GML_ERROR; /* LCOV_EXCL_LINE */

    return GML_OK;
}